

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O3

void __thiscall Centaurus::ATNNode<char>::~ATNNode(ATNNode<char> *this)

{
  pointer pcVar1;
  pointer pwVar2;
  
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_0019be18;
  pcVar1 = (this->m_literal)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_literal).field_2) {
    operator_delete(pcVar1);
  }
  (this->m_nfa).super_NFABase<Centaurus::NFABaseState<char,_int>_>._vptr_NFABase =
       (_func_int **)&PTR__NFABase_0019bed0;
  std::
  vector<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>::
  ~vector(&(this->m_nfa).super_NFABase<Centaurus::NFABaseState<char,_int>_>.m_states);
  (this->m_invoke)._vptr_Identifier = (_func_int **)&PTR__Identifier_0019be48;
  pwVar2 = (this->m_invoke).m_id._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar2 != &(this->m_invoke).m_id.field_2) {
    operator_delete(pwVar2);
  }
  std::vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>::
  ~vector(&this->m_transitions);
  return;
}

Assistant:

virtual ~ATNNode()
    {
    }